

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pretty-format.c
# Opt level: O0

int as_escaped_char(int c,int chr)

{
  int chr_local;
  int c_local;
  undefined4 local_4;
  
  if (c == 7) {
    local_4 = 0x61;
  }
  else if (c == 8) {
    local_4 = 0x62;
  }
  else if (c == 9) {
    local_4 = 0x74;
  }
  else if (c == 10) {
    local_4 = 0x6e;
  }
  else if (c == 0xb) {
    local_4 = 0x76;
  }
  else if (c == 0xc) {
    local_4 = 0x66;
  }
  else if (c == 0xd) {
    local_4 = 0x72;
  }
  else if (c == 0x5c) {
    local_4 = 0x5c;
  }
  else if ((chr == 0) || (c != 0x27)) {
    if ((chr == 0) && (c == 0x22)) {
      local_4 = 0x22;
    }
    else {
      local_4 = -1;
    }
  }
  else {
    local_4 = 0x27;
  }
  return local_4;
}

Assistant:

static int as_escaped_char(int c, int chr)
{
    switch(c)
    {
        case '\a': return 'a';
        case '\b': return 'b';
        case '\t': return 't';
        case '\n': return 'n';
        case '\v': return 'v';
        case '\f': return 'f';
        case '\r': return 'r';
        case '\\': return '\\';
        default:
            if(chr && c == '\'')
                return '\'';
            else if(!chr && c == '"')
                return '"';
            else return -1;
    }
}